

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddGroup.c
# Opt level: O3

int zddReorderChildren(DdManager *table,MtrNode *treenode,Cudd_ReorderingType method)

{
  uint lower;
  MtrHalfWord MVar1;
  MtrHalfWord MVar2;
  DdSubtable *pDVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  DdNode *pDVar10;
  uint uVar11;
  MtrNode *pMVar12;
  uint upper;
  long lVar13;
  long lVar14;
  uint *puVar15;
  int *piVar16;
  void *__ptr;
  ulong uVar17;
  void *__ptr_00;
  int *piVar18;
  DdNode *pDVar19;
  DdNode *pDVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  DdNode *local_78;
  uint local_6c;
  void *local_68;
  void *local_60;
  int *local_58;
  uint local_4c;
  long local_48;
  long local_40;
  long local_38;
  
  uVar6 = table->sizeZ;
  if ((int)uVar6 <= (int)treenode->low) {
    return 1;
  }
  piVar16 = table->permZ;
  lower = piVar16[treenode->index];
  upper = (lower + treenode->size) - 1;
  if ((int)uVar6 <= (int)upper) {
    pMVar12 = treenode->child;
    if (pMVar12 == (MtrNode *)0x0) {
      upper = uVar6 - 1;
    }
    else {
      upper = 0xffffffff;
      do {
        uVar11 = piVar16[pMVar12->low] - 1;
        if ((int)(pMVar12->size + uVar11) < (int)uVar6) {
          uVar11 = upper;
        }
        if (piVar16[pMVar12->low] < (int)uVar6) {
          upper = uVar11;
        }
        pMVar12 = pMVar12->younger;
      } while (pMVar12 != (MtrNode *)0x0);
    }
  }
  if (upper == 0xffffffff) {
    return 1;
  }
  iVar7 = 1;
  if (treenode->flags != 4) {
    iVar8 = 0;
    switch(method) {
    case CUDD_REORDER_RANDOM:
    case CUDD_REORDER_RANDOM_PIVOT:
      iVar7 = cuddZddSwapping(table,lower,upper,method);
      break;
    case CUDD_REORDER_SIFT:
      iVar7 = cuddZddSifting(table,lower,upper);
      break;
    case CUDD_REORDER_SIFT_CONVERGE:
      uVar6 = table->keysZ;
      do {
        iVar7 = cuddZddSifting(table,lower,upper);
        if (uVar6 <= table->keysZ) break;
        uVar6 = table->keysZ;
      } while (iVar7 != 0);
      break;
    case CUDD_REORDER_SYMM_SIFT:
      iVar7 = cuddZddSymmSifting(table,lower,upper);
      break;
    case CUDD_REORDER_SYMM_SIFT_CONV:
      iVar7 = cuddZddSymmSiftingConv(table,lower,upper);
      break;
    default:
      goto switchD_007a848b_caseD_8;
    case CUDD_REORDER_GROUP_SIFT:
      entry = (int *)0x0;
      local_60 = (void *)((long)(int)uVar6 << 2);
      local_68 = malloc((size_t)local_60);
      if (local_68 == (void *)0x0) {
        table->errorCode = CUDD_MEMORY_OUT;
      }
      else {
        entry = (int *)malloc((size_t)local_60);
        if (entry != (int *)0x0) {
          local_58 = entry;
          local_60 = malloc((size_t)local_60);
          if (local_60 == (void *)0x0) {
            table->errorCode = CUDD_MEMORY_OUT;
            piVar16 = local_58;
LAB_007a877c:
            free(piVar16);
            entry = (int *)0x0;
LAB_007a878c:
            free(local_68);
            iVar7 = 0;
            if (local_60 != (void *)0x0) {
              free(local_60);
            }
          }
          else {
            if ((int)uVar6 < 1) {
              piVar18 = (int *)0x0;
            }
            else {
              pDVar3 = table->subtableZ;
              uVar17 = 0;
              piVar18 = (int *)0x0;
              do {
                *(undefined4 *)((long)local_60 + uVar17 * 4) = 0;
                uVar11 = piVar16[uVar17];
                if (pDVar3[(int)uVar11].next <= uVar11) {
                  local_58[uVar17] = pDVar3[(int)uVar11].keys;
                  *(int *)((long)local_68 + (long)(int)piVar18 * 4) = (int)uVar17;
                  piVar18 = (int *)(ulong)((int)piVar18 + 1);
                }
                uVar17 = uVar17 + 1;
              } while (uVar6 != uVar17);
            }
            local_58 = piVar18;
            qsort(local_68,(long)(int)piVar18,4,zddUniqueCompareGroup);
            iVar8 = table->siftMaxVar;
            if ((int)piVar18 < iVar8) {
              iVar8 = (int)local_58;
            }
            __ptr = local_60;
            __ptr_00 = local_68;
            if (0 < iVar8) {
              lVar9 = 0;
              piVar16 = local_58;
              do {
                if (table->siftMaxSwap <= zddTotalNumberSwapping) break;
                lVar13 = (long)*(int *)((long)__ptr_00 + lVar9 * 4);
                if (((*(int *)((long)__ptr + lVar13 * 4) != 1) &&
                    (uVar6 = table->permZ[lVar13], (int)lower <= (int)uVar6)) &&
                   ((int)uVar6 <= (int)upper)) {
                  uVar11 = table->keysZ;
                  local_78 = (DdNode *)0x0;
                  if (uVar6 == lower) {
                    if (lower != upper) {
                      local_40 = lVar13;
                      local_38 = lVar9;
                      iVar8 = zddGroupSiftingDown(table,lower,upper,(Move **)&local_78);
                      pDVar20 = local_78;
                      if (iVar8 == 0) goto LAB_007a8aa6;
LAB_007a89d0:
                      pDVar20 = local_78;
                      iVar8 = zddGroupSiftingBackward(table,(Move *)local_78,uVar11);
                      if (iVar8 == 0) goto LAB_007a8aa6;
                      lVar13 = local_40;
                      __ptr = local_60;
                      __ptr_00 = local_68;
                      piVar16 = local_58;
                      lVar9 = local_38;
                      if (pDVar20 != (DdNode *)0x0) {
                        pDVar10 = table->nextFree;
                        do {
                          pDVar19 = pDVar20;
                          pDVar20 = (pDVar19->type).kids.T;
                          pDVar19->ref = 0;
                          pDVar19->next = pDVar10;
                          pDVar10 = pDVar19;
                        } while (pDVar20 != (DdNode *)0x0);
                        table->nextFree = pDVar19;
                      }
                    }
                    pDVar3 = table->subtableZ;
                    uVar6 = table->permZ[lVar13];
                    if (uVar6 != pDVar3[(int)uVar6].next) {
                      piVar18 = table->invpermZ;
                      uVar11 = uVar6;
                      do {
                        *(undefined4 *)((long)__ptr + (long)piVar18[(int)uVar11] * 4) = 1;
                        uVar11 = pDVar3[(int)uVar11].next;
                      } while (uVar11 != uVar6);
                    }
                    goto LAB_007a8827;
                  }
                  local_48 = (long)(int)uVar6;
                  local_6c = uVar11;
                  local_4c = uVar6;
                  local_40 = lVar13;
                  local_38 = lVar9;
                  iVar8 = cuddZddNextHigh(table,uVar6);
                  if ((int)upper < iVar8) {
                    uVar11 = table->subtableZ[local_48].next;
LAB_007a8940:
                    iVar8 = zddGroupSiftingUp(table,uVar11,lower,(Move **)&local_78);
LAB_007a89b9:
                    pDVar20 = local_78;
                    uVar11 = local_6c;
                    if (iVar8 != 0) goto LAB_007a89d0;
                  }
                  else if ((int)(upper - uVar6) < (int)(uVar6 - lower)) {
                    iVar8 = zddGroupSiftingDown(table,local_4c,upper,(Move **)&local_78);
                    pDVar20 = local_78;
                    if (iVar8 != 0) {
                      uVar6 = local_4c;
                      if (local_78 != (DdNode *)0x0) {
                        uVar6 = local_78->ref;
                      }
                      do {
                        uVar11 = table->subtableZ[(int)uVar6].next;
                        bVar21 = uVar6 < uVar11;
                        uVar6 = uVar11;
                      } while (bVar21);
                      goto LAB_007a8940;
                    }
                  }
                  else {
                    uVar6 = table->subtableZ[local_48].next;
                    iVar8 = zddGroupSiftingUp(table,uVar6,lower,(Move **)&local_78);
                    pDVar20 = local_78;
                    if (iVar8 != 0) {
                      if (local_78 != (DdNode *)0x0) {
                        uVar6 = local_78->index;
                      }
                      do {
                        uVar11 = uVar6;
                        uVar6 = table->subtableZ[(int)uVar11].next;
                      } while (uVar11 < uVar6);
                      iVar8 = zddGroupSiftingDown(table,uVar11,upper,(Move **)&local_78);
                      goto LAB_007a89b9;
                    }
                  }
LAB_007a8aa6:
                  if (pDVar20 != (DdNode *)0x0) {
                    pDVar10 = table->nextFree;
                    do {
                      pDVar19 = pDVar20;
                      pDVar20 = (pDVar19->type).kids.T;
                      pDVar19->ref = 0;
                      pDVar19->next = pDVar10;
                      pDVar10 = pDVar19;
                    } while (pDVar20 != (DdNode *)0x0);
                    table->nextFree = pDVar19;
                  }
                  piVar16 = entry;
                  if (entry != (int *)0x0) goto LAB_007a877c;
                  goto LAB_007a878c;
                }
LAB_007a8827:
                lVar9 = lVar9 + 1;
                iVar8 = table->siftMaxVar;
                if ((int)piVar16 < table->siftMaxVar) {
                  iVar8 = (int)piVar16;
                }
              } while (lVar9 < iVar8);
            }
            free(__ptr);
            free(__ptr_00);
            if (entry != (int *)0x0) {
              free(entry);
              entry = (int *)0x0;
            }
          }
          break;
        }
        table->errorCode = CUDD_MEMORY_OUT;
        free(local_68);
      }
      iVar7 = 0;
      break;
    case CUDD_REORDER_LINEAR:
      iVar7 = cuddZddLinearSifting(table,lower,upper);
      break;
    case CUDD_REORDER_LINEAR_CONVERGE:
      uVar6 = table->keysZ;
      do {
        iVar7 = cuddZddLinearSifting(table,lower,upper);
        if (uVar6 <= table->keysZ) break;
        uVar6 = table->keysZ;
      } while (iVar7 != 0);
    }
  }
  auVar5 = _DAT_007ee2e0;
  auVar4 = _DAT_007ee2d0;
  lVar9 = (long)(int)lower;
  if (table->treeZ != treenode) {
    pDVar3 = table->subtableZ;
    if ((int)lower < (int)upper) {
      lVar13 = (int)upper - lVar9;
      lVar14 = lVar13 + -1;
      auVar22._0_8_ = (long)(int)lower;
      auVar22._8_4_ = lower;
      auVar22._12_4_ = (int)lower >> 0x1f;
      lVar23 = auVar22._8_8_ + 1;
      auVar24._8_4_ = (int)lVar14;
      auVar24._0_8_ = lVar14;
      auVar24._12_4_ = (int)((ulong)lVar14 >> 0x20);
      puVar15 = &pDVar3[lVar9 + 1].next;
      uVar17 = 0;
      auVar24 = auVar24 ^ _DAT_007ee2e0;
      do {
        auVar25._8_4_ = (int)uVar17;
        auVar25._0_8_ = uVar17;
        auVar25._12_4_ = (int)(uVar17 >> 0x20);
        auVar25 = (auVar25 | auVar4) ^ auVar5;
        if ((bool)(~(auVar25._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar25._0_4_ ||
                    auVar24._4_4_ < auVar25._4_4_) & 1)) {
          puVar15[-0xe] = (int)(auVar22._0_8_ + 1);
        }
        if ((auVar25._12_4_ != auVar24._12_4_ || auVar25._8_4_ <= auVar24._8_4_) &&
            auVar25._12_4_ <= auVar24._12_4_) {
          *puVar15 = (uint)(lVar23 + 1);
        }
        uVar17 = uVar17 + 2;
        auVar22._0_8_ = auVar22._0_8_ + 2;
        lVar23 = lVar23 + 2;
        puVar15 = puVar15 + 0x1c;
      } while ((lVar13 + 1U & 0xfffffffffffffffe) != uVar17);
    }
    pDVar3[(int)upper].next = lower;
  }
  MVar1 = treenode->index;
  MVar2 = table->invpermZ[lVar9];
  do {
    treenode->index = MVar2;
    treenode = treenode->parent;
    if (treenode == (MtrNode *)0x0) {
      return iVar7;
    }
    iVar8 = iVar7;
  } while (treenode->index == MVar1);
switchD_007a848b_caseD_8:
  return iVar8;
}

Assistant:

static int
zddReorderChildren(
  DdManager * table,
  MtrNode * treenode,
  Cudd_ReorderingType method)
{
    int lower;
    int upper = -1;
    int result;
    unsigned int initialSize;

    zddFindNodeHiLo(table,treenode,&lower,&upper);
    /* If upper == -1 these variables do not exist yet. */
    if (upper == -1)
        return(1);

    if (treenode->flags == MTR_FIXED) {
        result = 1;
    } else {
#ifdef DD_STATS
        (void) fprintf(table->out," ");
#endif
        switch (method) {
        case CUDD_REORDER_RANDOM:
        case CUDD_REORDER_RANDOM_PIVOT:
            result = cuddZddSwapping(table,lower,upper,method);
            break;
        case CUDD_REORDER_SIFT:
            result = cuddZddSifting(table,lower,upper);
            break;
        case CUDD_REORDER_SIFT_CONVERGE:
            do {
                initialSize = table->keysZ;
                result = cuddZddSifting(table,lower,upper);
                if (initialSize <= table->keysZ)
                    break;
#ifdef DD_STATS
                else
                    (void) fprintf(table->out,"\n");
#endif
            } while (result != 0);
            break;
        case CUDD_REORDER_SYMM_SIFT:
            result = cuddZddSymmSifting(table,lower,upper);
            break;
        case CUDD_REORDER_SYMM_SIFT_CONV:
            result = cuddZddSymmSiftingConv(table,lower,upper);
            break;
        case CUDD_REORDER_GROUP_SIFT:
            result = zddGroupSifting(table,lower,upper);
            break;
        case CUDD_REORDER_LINEAR:
            result = cuddZddLinearSifting(table,lower,upper);
            break;
        case CUDD_REORDER_LINEAR_CONVERGE:
            do {
                initialSize = table->keysZ;
                result = cuddZddLinearSifting(table,lower,upper);
                if (initialSize <= table->keysZ)
                    break;
#ifdef DD_STATS
                else
                    (void) fprintf(table->out,"\n");
#endif
            } while (result != 0);
            break;
        default:
            return(0);
        }
    }

    /* Create a single group for all the variables that were sifted,
    ** so that they will be treated as a single block by successive
    ** invocations of zddGroupSifting.
    */
    zddMergeGroups(table,treenode,lower,upper);

#ifdef DD_DEBUG
    if (pr > 0) (void) fprintf(table->out,"zddReorderChildren:");
#endif

    return(result);

}